

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void AddVarArrayField(FMFieldList *FieldP,int *CountP,char *Name,int Type,int ElementSize,
                     char *SizeField)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *__s_00;
  undefined4 in_ECX;
  int *in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  int *in_R9;
  char *TypeWithArray;
  char *TransType;
  int in_stack_ffffffffffffffac;
  int ElementSize_00;
  char *Type_00;
  
  __s = TranslateADIOS2Type2FFS(in_stack_ffffffffffffffac);
  sVar1 = strlen(__s);
  sVar2 = strlen((char *)in_R9);
  __s_00 = (char *)malloc(sVar1 + sVar2 + 8);
  Type_00 = __s_00;
  sVar1 = strlen(__s);
  sVar2 = strlen((char *)in_R9);
  snprintf(__s_00,sVar1 + sVar2 + 8,"%s[%s]",__s,in_R9);
  ElementSize_00 = (int)((ulong)__s_00 >> 0x20);
  free(__s);
  AddSimpleField((FMFieldList *)CONCAT44(in_ECX,in_R8D),in_R9,__s,Type_00,ElementSize_00);
  free(Type_00);
  *(undefined4 *)(*in_RDI + (long)(*in_RSI + -1) * 0x18 + 0x10) = in_R8D;
  return;
}

Assistant:

static void AddVarArrayField(FMFieldList *FieldP, int *CountP, const char *Name, const int Type,
                             int ElementSize, char *SizeField)
{
    char *TransType = TranslateADIOS2Type2FFS(Type);
    char *TypeWithArray = malloc(strlen(TransType) + strlen(SizeField) + 8);
    snprintf(TypeWithArray, strlen(TransType) + strlen(SizeField) + 8, "%s[%s]", TransType,
             SizeField);
    free(TransType);
    AddSimpleField(FieldP, CountP, Name, TypeWithArray, sizeof(void *));
    free(TypeWithArray);
    (*FieldP)[*CountP - 1].field_size = ElementSize;
}